

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O0

void __thiscall disp::p_2(disp *this,int x,int y)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int in_stack_0000010c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  __lhs = &local_90;
  to_string<int>(in_stack_0000010c);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  to_string<int>(in_stack_0000010c);
  std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::__cxx11::string::operator=((string *)&in_RDI[1]._M_string_length,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void p_2(int x,int y) { v_="p_2:" + to_string(x) + ":" + to_string(y); }